

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * vdbeMemTypeName(Mem *pMem)

{
  int iVar1;
  Mem *pMem_local;
  
  iVar1 = sqlite3_value_type(pMem);
  return vdbeMemTypeName::azTypes[iVar1 + -1];
}

Assistant:

static const char *vdbeMemTypeName(Mem *pMem){
  static const char *azTypes[] = {
      /* SQLITE_INTEGER */ "INT",
      /* SQLITE_FLOAT   */ "REAL",
      /* SQLITE_TEXT    */ "TEXT",
      /* SQLITE_BLOB    */ "BLOB",
      /* SQLITE_NULL    */ "NULL"
  };
  return azTypes[sqlite3_value_type(pMem)-1];
}